

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O0

void __thiscall xemmai::t_thread::f_join(t_thread *this)

{
  t_engine *ptVar1;
  t_object *this_00;
  t_thread *ptVar2;
  long *in_FS_OFFSET;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  wstring_view a_message;
  wstring_view a_message_00;
  undefined1 local_50 [8];
  unique_lock<std::mutex> lock;
  xemmai *pxStack_38;
  t_safe_region region;
  t_engine *engine;
  t_thread *this_local;
  
  if (this->v_internal == *(t_internal **)(*in_FS_OFFSET + -0x28)) {
    bVar3 = sv(L"current thread can not be joined.",0x21);
    a_message._M_str = bVar3._M_str;
    engine = (t_engine *)bVar3._M_len;
    a_message._M_len = (size_t)a_message._M_str;
    f_throw((xemmai *)engine,a_message);
  }
  ptVar1 = f_engine();
  this_00 = t_slot::operator->(&(ptVar1->v_thread).super_t_slot);
  ptVar2 = t_object::f_as<xemmai::t_thread>(this_00);
  if (this == ptVar2) {
    bVar3 = sv(L"engine thread can not be joined.",0x20);
    a_message_00._M_str = bVar3._M_str;
    pxStack_38 = (xemmai *)bVar3._M_len;
    a_message_00._M_len = (size_t)a_message_00._M_str;
    f_throw(pxStack_38,a_message_00);
  }
  t_safe_region::t_safe_region((t_safe_region *)&lock.field_0xf);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_50,&ptVar1->v_thread__mutex);
  while (this->v_internal != (t_internal *)0x0) {
    std::condition_variable::wait((unique_lock *)&ptVar1->v_thread__condition);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
  t_safe_region::~t_safe_region((t_safe_region *)&lock.field_0xf);
  return;
}

Assistant:

void t_thread::f_join()
{
	if (v_internal == v_current) f_throw(L"current thread can not be joined."sv);
	auto engine = f_engine();
	if (this == &engine->v_thread->f_as<t_thread>()) f_throw(L"engine thread can not be joined."sv);
	t_safe_region region;
	std::unique_lock lock(engine->v_thread__mutex);
	while (v_internal) engine->v_thread__condition.wait(lock);
}